

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O3

PSprite __thiscall
DataSourceBase::get_sprite(DataSourceBase *this,Resource res,size_t index,Color *color)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  uint uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  undefined4 in_register_00000034;
  undefined4 *in_R8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  PSprite PVar4;
  MaskImage ms;
  _func_int **local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  undefined4 *local_58;
  Source local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _func_int **local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  uVar2 = Data::get_resource_count((Resource)index);
  if (color < (Color *)(ulong)uVar2) {
    local_58 = in_R8;
    (**(code **)(*(long *)CONCAT44(in_register_00000034,res) + 0x40))
              (&local_50,(long *)CONCAT44(in_register_00000034,res),index & 0xffffffff,color);
    p_Var1 = local_38;
    this_00 = local_48;
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_38->_M_use_count = local_38->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_38->_M_use_count = local_38->_M_use_count + 1;
      }
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_48->_M_use_count = local_48->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_48->_M_use_count = local_48->_M_use_count + 1;
      }
    }
    if (local_40 == (_func_int **)0x0) {
      (this->super_Source)._vptr_Source = local_50._vptr_Source;
      (this->path)._M_dataplus._M_p = (pointer)local_48;
      _Var3._M_pi = extraout_RDX_00;
      this_00 = local_38;
    }
    else {
      (**(code **)(*local_40 + 0x50))(local_40,*local_58);
      _Var3._M_pi = extraout_RDX_01;
      if (local_50._vptr_Source != (_func_int **)0x0) {
        local_68 = local_50._vptr_Source;
        local_60 = this_00;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        (**(code **)(*local_40 + 0x68))(local_40,&local_68);
        _Var3._M_pi = extraout_RDX_02;
        if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
          _Var3._M_pi = extraout_RDX_03;
        }
      }
      (this->super_Source)._vptr_Source = local_40;
      (this->path)._M_dataplus._M_p = (pointer)p_Var1;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var3._M_pi = extraout_RDX_04;
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      _Var3._M_pi = extraout_RDX_05;
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      _Var3._M_pi = extraout_RDX_06;
    }
  }
  else {
    (this->super_Source)._vptr_Source = (_func_int **)0x0;
    (this->path)._M_dataplus._M_p = (pointer)0x0;
    _Var3._M_pi = extraout_RDX;
  }
  PVar4.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi
  ;
  PVar4.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PSprite)PVar4.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Data::PSprite
DataSourceBase::get_sprite(Data::Resource res, size_t index,
                           const Data::Sprite::Color &color) {
  if (index >= Data::get_resource_count(res)) {
    return nullptr;
  }

  Data::MaskImage ms = get_sprite_parts(res, index);
  Data::PSprite mask = std::get<0>(ms);
  Data::PSprite image = std::get<1>(ms);

  if (mask) {
    mask->fill_masked(color);
    if (image) {
      mask->blend(image);
      return mask;
    }
    return mask;
  }

  return image;
}